

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint128_t __thiscall
farmhashcc::CityHash128WithSeed(farmhashcc *this,char *s,size_t len,uint128_t seed)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  long *plVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  farmhashcc *pfVar15;
  ulong uVar16;
  uint128_t uVar17;
  
  uVar13 = seed.first;
  if ((char *)0x7f < s) {
    uVar16 = (long)s * -0x4b6d499041670d8d;
    uVar10 = ((uVar13 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar13 ^ 0xb492b66fbe98f273) << 0xf) *
             -0x4b6d499041670d8d + *(long *)this;
    lVar9 = (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d + *(long *)(this + 8);
    uVar7 = (uVar16 + uVar13 >> 0x23 | (uVar16 + uVar13) * 0x20000000) * -0x4b6d499041670d8d + len;
    uVar11 = (*(long *)(this + 0x58) + len >> 0x35 | (*(long *)(this + 0x58) + len) * 0x800) *
             -0x4b6d499041670d8d;
    pfVar15 = this + 0x78;
    pcVar5 = s;
    do {
      uVar2 = len + uVar10 + uVar13 + *(long *)(pfVar15 + -0x70);
      uVar13 = uVar13 + lVar9 + *(long *)(pfVar15 + -0x48);
      uVar2 = (uVar2 >> 0x25 | uVar2 * 0x8000000) * -0x4b6d499041670d8d ^ uVar11;
      lVar3 = uVar10 + *(long *)(pfVar15 + -0x50) +
              (uVar13 >> 0x2a | uVar13 * 0x400000) * -0x4b6d499041670d8d;
      lVar1 = (uVar16 + uVar7 >> 0x21 | (uVar16 + uVar7) * 0x80000000) * -0x4b6d499041670d8d;
      lVar8 = lVar9 * -0x4b6d499041670d8d + *(long *)(pfVar15 + -0x78);
      uVar7 = uVar7 + lVar8 + *(long *)(pfVar15 + -0x60) + uVar2;
      uVar13 = *(long *)(pfVar15 + -0x70) + lVar8 + *(long *)(pfVar15 + -0x68);
      lVar9 = uVar13 + *(long *)(pfVar15 + -0x60);
      lVar8 = (uVar13 >> 0x2c | uVar13 * 0x100000) + lVar8 + (uVar7 >> 0x15 | uVar7 << 0x2b);
      lVar12 = uVar11 + lVar1 + *(long *)(pfVar15 + -0x58);
      uVar13 = *(long *)(pfVar15 + -0x68) + lVar12 + lVar3 + *(long *)(pfVar15 + -0x40);
      uVar7 = *(long *)(pfVar15 + -0x50) + *(long *)(pfVar15 + -0x48) + lVar12;
      lVar14 = uVar7 + *(long *)(pfVar15 + -0x40);
      uVar7 = (uVar7 >> 0x2c | uVar7 * 0x100000) + lVar12 + (uVar13 >> 0x15 | uVar13 << 0x2b);
      uVar13 = lVar1 + lVar9 + *(long *)(pfVar15 + -0x30) + lVar3;
      uVar10 = lVar3 + *(long *)(pfVar15 + -8) + lVar8;
      uVar16 = (uVar13 >> 0x25 | uVar13 * 0x8000000) * -0x4b6d499041670d8d ^ uVar7;
      uVar13 = lVar9 + *(long *)(pfVar15 + -0x10) +
               (uVar10 >> 0x2a | uVar10 * 0x400000) * -0x4b6d499041670d8d;
      uVar2 = uVar2 + lVar14;
      len = (uVar2 >> 0x21 | uVar2 * 0x80000000) * -0x4b6d499041670d8d;
      lVar9 = lVar8 * -0x4b6d499041670d8d + *(long *)(pfVar15 + -0x38);
      uVar2 = lVar14 + uVar16 + *(long *)(pfVar15 + -0x20) + lVar9;
      uVar11 = *(long *)(pfVar15 + -0x30) + *(long *)(pfVar15 + -0x28) + lVar9;
      uVar10 = uVar11 + *(long *)(pfVar15 + -0x20);
      lVar9 = (uVar11 >> 0x2c | uVar11 * 0x100000) + lVar9 + (uVar2 >> 0x15 | uVar2 << 0x2b);
      lVar1 = uVar7 + len + *(long *)(pfVar15 + -0x18);
      uVar11 = *(long *)(pfVar15 + -0x28) + uVar13 + *(long *)pfVar15 + lVar1;
      uVar2 = *(long *)(pfVar15 + -0x10) + *(long *)(pfVar15 + -8) + lVar1;
      uVar7 = uVar2 + *(long *)pfVar15;
      uVar11 = (uVar2 >> 0x2c | uVar2 * 0x100000) + lVar1 + (uVar11 >> 0x15 | uVar11 << 0x2b);
      pcVar5 = pcVar5 + -0x80;
      pfVar15 = pfVar15 + 0x80;
    } while ((char *)0x7f < pcVar5);
    uVar2 = (uVar10 + uVar16 >> 0x31 | (uVar10 + uVar16) * 0x8000) * -0x3c5a37a36834ced9 + len;
    lVar3 = (uVar11 >> 0x25 | uVar11 * 0x8000000) + uVar13 * -0x3c5a37a36834ced9;
    lVar1 = (uVar7 >> 0x1b | uVar7 << 0x25) + uVar16 * -0x3c5a37a36834ced9;
    uVar7 = uVar7 * 9;
    uVar10 = uVar10 * -0x3c5a37a36834ced9;
    if (pcVar5 != (char *)0x0) {
      plVar4 = (long *)(s + -8 + (long)this);
      pcVar6 = (char *)0x0;
      do {
        pcVar6 = pcVar6 + 0x20;
        lVar3 = (lVar3 + uVar2 >> 0x2a | (lVar3 + uVar2) * 0x400000) * -0x3c5a37a36834ced9 + lVar9;
        uVar7 = uVar7 + plVar4[-1];
        uVar2 = uVar2 * -0x3c5a37a36834ced9 + uVar7;
        lVar1 = lVar1 + uVar11 + plVar4[-3];
        uVar11 = uVar11 + uVar10;
        lVar8 = plVar4[-3] + uVar10 + lVar1;
        uVar10 = lVar9 + *plVar4 + lVar8;
        uVar13 = plVar4[-1] + plVar4[-2] + lVar8;
        lVar9 = (uVar13 >> 0x2c | uVar13 * 0x100000) + lVar8 + (uVar10 >> 0x15 | uVar10 << 0x2b);
        uVar10 = (uVar13 + *plVar4) * -0x3c5a37a36834ced9;
        plVar4 = plVar4 + -4;
      } while (pcVar6 < pcVar5);
    }
    uVar13 = (uVar2 ^ uVar10) * -0x622015f714c7d297;
    uVar13 = (uVar13 >> 0x2f ^ uVar10 ^ uVar13) * -0x622015f714c7d297;
    lVar8 = (uVar13 >> 0x2f ^ uVar13) * -0x622015f714c7d297;
    uVar13 = (lVar1 + lVar3 ^ uVar7) * -0x622015f714c7d297;
    uVar13 = (uVar13 >> 0x2f ^ uVar7 ^ uVar13) * -0x622015f714c7d297;
    uVar13 = uVar13 >> 0x2f ^ uVar13;
    uVar7 = (lVar8 + lVar9 ^ uVar11) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ uVar11 ^ uVar7) * -0x622015f714c7d297;
    uVar7 = ((uVar7 >> 0x2f ^ uVar7) + uVar13) * -0x622015f714c7d297;
    uVar10 = uVar13 * -0x622015f714c7d297 + lVar9;
    uVar13 = lVar8 + uVar11 ^ uVar10;
    goto LAB_00180812;
  }
  if ((long)s < 0x11) {
    lVar9 = -0x651e95c4d06fbfb1;
    if (s < (char *)0x8) {
      if ((char *)0x3 < s) {
        lVar9 = (long)s * 2 + -0x651e95c4d06fbfb1;
        uVar7 = ((ulong)(s + (ulong)*(uint *)this * 8) ^ (ulong)*(uint *)(this + -4 + (long)s)) *
                lVar9;
        uVar7 = (uVar7 >> 0x2f ^ *(uint *)(this + -4 + (long)s) ^ uVar7) * lVar9;
        uVar7 = uVar7 >> 0x2f ^ uVar7;
        goto LAB_001807a2;
      }
      if (s != (char *)0x0) {
        uVar7 = ((ulong)(byte)(this + -1)[(long)s] << 2 | (ulong)s) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(this[(ulong)s >> 1],*this) * -0x651e95c4d06fbfb1;
        lVar9 = (uVar7 >> 0x2f ^ uVar7) * -0x651e95c4d06fbfb1;
      }
    }
    else {
      lVar9 = (long)s * 2 + -0x651e95c4d06fbfb1;
      uVar10 = *(long *)this + 0x9ae16a3b2f90404f;
      uVar7 = *(ulong *)(this + -8 + (long)s);
      uVar11 = ((uVar10 >> 0x19 | uVar10 << 0x27) + uVar7) * lVar9;
      uVar7 = ((uVar7 >> 0x25 | uVar7 << 0x1b) * lVar9 + uVar10 ^ uVar11) * lVar9;
      uVar7 = (uVar7 >> 0x2f ^ uVar11 ^ uVar7) * lVar9;
      uVar7 = uVar7 >> 0x2f ^ uVar7;
LAB_001807a2:
      lVar9 = uVar7 * lVar9;
    }
    uVar7 = lVar9 + uVar13 * -0x4b6d499041670d8d;
    uVar10 = (len * -0x4b6d499041670d8d >> 0x2f ^ len * -0x4b6d499041670d8d) * -0x4b6d499041670d8d;
    uVar11 = uVar7;
    if ((char *)0x7 < s) {
      uVar11 = *(ulong *)this;
    }
    uVar11 = uVar11 + uVar10 >> 0x2f ^ uVar11 + uVar10;
  }
  else {
    uVar7 = (*(long *)(this + -8 + (long)s) + 0xb492b66fbe98f273U ^ len) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ len ^ uVar7) * -0x622015f714c7d297;
    uVar7 = (uVar7 >> 0x2f ^ uVar7) * -0x622015f714c7d297;
    uVar10 = ((ulong)(s + uVar13) ^ *(long *)(this + -0x10 + (long)s) + uVar7) * -0x622015f714c7d297
    ;
    uVar10 = (uVar10 >> 0x2f ^ *(long *)(this + -0x10 + (long)s) + uVar7 ^ uVar10) *
             -0x622015f714c7d297;
    uVar11 = (uVar10 >> 0x2f ^ uVar10) * -0x622015f714c7d297;
    uVar10 = len + uVar11;
    pcVar5 = s + 0x10;
    do {
      uVar10 = (((ulong)(*(long *)this * -0x4b6d499041670d8d) >> 0x2f ^
                *(long *)this * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar10) *
               -0x4b6d499041670d8d;
      uVar13 = uVar13 ^ uVar10;
      uVar7 = (((ulong)(*(long *)(this + 8) * -0x4b6d499041670d8d) >> 0x2f ^
               *(long *)(this + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar7) *
              -0x4b6d499041670d8d;
      uVar11 = uVar11 ^ uVar7;
      this = this + 0x10;
      pcVar5 = pcVar5 + -0x10;
    } while (0x20 < (long)pcVar5);
  }
  uVar10 = (uVar10 ^ uVar7) * -0x622015f714c7d297;
  uVar7 = (uVar10 >> 0x2f ^ uVar7 ^ uVar10) * -0x622015f714c7d297;
  uVar10 = (uVar7 >> 0x2f ^ uVar7) * -0x622015f714c7d297;
  uVar7 = (uVar11 ^ uVar13) * -0x622015f714c7d297;
  uVar13 = (uVar7 >> 0x2f ^ uVar13 ^ uVar7) * -0x622015f714c7d297;
  uVar7 = (uVar13 >> 0x2f ^ uVar13) * -0x622015f714c7d297 ^ uVar10;
  uVar13 = uVar7;
LAB_00180812:
  uVar13 = (uVar13 * -0x622015f714c7d297 >> 0x2f ^ uVar10 ^ uVar13 * -0x622015f714c7d297) *
           -0x622015f714c7d297;
  uVar17.second = (uVar13 >> 0x2f ^ uVar13) * -0x622015f714c7d297;
  uVar17.first = uVar7;
  return uVar17;
}

Assistant:

uint128_t CityHash128WithSeed(const char *s, size_t len, uint128_t seed) {
  if (len < 128) {
    return CityMurmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  pair<uint64_t, uint64_t> v, w;
  uint64_t x = Uint128Low64(seed);
  uint64_t y = Uint128High64(seed);
  uint64_t z = len * k1;
  v.first = Rotate(y ^ k1, 49) * k1 + Fetch(s);
  v.second = Rotate(v.first, 42) * k1 + Fetch(s + 8);
  w.first = Rotate(y + z, 35) * k1 + x;
  w.second = Rotate(x + Fetch(s + 88), 53) * k1;

  // This is the same inner loop as CityHash64(), manually unrolled.
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 128;
  } while (LIKELY(len >= 128));
  x += Rotate(v.first + z, 49) * k0;
  y = y * k0 + Rotate(w.second, 37);
  z = z * k0 + Rotate(w.first, 27);
  w.first *= 9;
  v.first *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (size_t tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = Rotate(x + y, 42) * k0 + v.second;
    w.first += Fetch(s + len - tail_done + 16);
    x = x * k0 + w.first;
    z += w.second + Fetch(s + len - tail_done);
    w.second += v.first;
    v = WeakHashLen32WithSeeds(s + len - tail_done, v.first + z, v.second);
    v.first *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = HashLen16(x, v.first);
  y = HashLen16(y + z, w.first);
  return uint128_t(HashLen16(x + v.second, w.second) + y,
                   HashLen16(x + w.second, y + v.second));
}